

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O0

void __thiscall deqp::gls::FragOpInteractionCase::deinit(FragOpInteractionCase *this)

{
  ReferenceContext *this_00;
  FragOpInteractionCase *this_local;
  
  this_00 = this->m_referenceCtx;
  if (this_00 != (ReferenceContext *)0x0) {
    ReferenceContext::~ReferenceContext(this_00);
    operator_delete(this_00,0x6280);
  }
  this->m_referenceCtx = (ReferenceContext *)0x0;
  if (this->m_glCtx != (GLContext *)0x0) {
    (*(this->m_glCtx->super_Context)._vptr_Context[1])();
  }
  this->m_glCtx = (GLContext *)0x0;
  if (this->m_program != (RandomShaderProgram *)0x0) {
    (*(this->m_program->super_ShaderProgram).super_VertexShader._vptr_VertexShader[2])();
  }
  this->m_program = (RandomShaderProgram *)0x0;
  return;
}

Assistant:

void FragOpInteractionCase::deinit (void)
{
	delete m_referenceCtx;
	m_referenceCtx = DE_NULL;

	delete m_glCtx;
	m_glCtx = DE_NULL;

	delete m_program;
	m_program = DE_NULL;
}